

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

int BN_mod_exp_mont_consttime
              (BIGNUM *rr,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx,BN_MONT_CTX *in_mont)

{
  uint top_00;
  ulong *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  BIGNUM *pBVar8;
  ulong *puVar9;
  unsigned_long **ppuVar10;
  unsigned_long uVar11;
  BIGNUM *pBVar12;
  undefined8 *puVar13;
  long lVar14;
  unsigned_long *in_stack_000003a8;
  unsigned_long in_stack_000003b0;
  unsigned_long *in_stack_000003b8;
  unsigned_long *in_stack_000003c0;
  unsigned_long *in_stack_000003c8;
  unsigned_long *in_stack_000003d0;
  unsigned_long in_stack_00001508;
  unsigned_long *in_stack_00001510;
  unsigned_long *in_stack_00001518;
  unsigned_long *in_stack_00001520;
  unsigned_long *in_stack_00001528;
  unsigned_long *in_stack_00001530;
  undefined1 local_148 [4];
  int words;
  BIGNUM *in_stack_fffffffffffffec0;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffffec8;
  uchar *puVar16;
  char *in_stack_fffffffffffffed0;
  unsigned_long **ppuVar17;
  int local_e8;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  int local_d4;
  int j;
  unsigned_long *np;
  unsigned_long *n0;
  BIGNUM *reduced;
  BIGNUM am;
  BIGNUM tmp;
  uchar *powerbuf;
  undefined1 *puStack_78;
  int powerbufLen;
  uchar *powerbufFree;
  BN_MONT_CTX *pBStack_68;
  int numPowers;
  BN_MONT_CTX *mont;
  int top;
  int window0;
  int wmask;
  int wvalue;
  int window;
  int ret;
  int bits;
  int i;
  BN_MONT_CTX *in_mont_local;
  BN_CTX *ctx_local;
  BIGNUM *m_local;
  BIGNUM *p_local;
  BIGNUM *a_local;
  BIGNUM *rr_local;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  wvalue = 0;
  puStack_78 = (undefined1 *)0x0;
  powerbuf._4_4_ = 0;
  tmp.neg = 0;
  tmp.flags = 0;
  iVar4 = BN_is_odd((BIGNUM *)m);
  if (iVar4 == 0) {
    ERR_new();
    ERR_set_debug(in_stack_fffffffffffffed0,iVar5,(char *)in_stack_fffffffffffffec0);
    ERR_set_error(3,0x66,(char *)0x0);
    return 0;
  }
  top_00 = m->top;
  iVar4 = p->top * 0x40;
  if (iVar4 == 0) {
    iVar4 = BN_abs_is_word((BIGNUM *)m,1);
    if (iVar4 == 0) {
      wvalue = BN_set_word(rr,1);
    }
    else {
      wvalue = 1;
      BN_zero_ex((BIGNUM *)rr);
    }
    return wvalue;
  }
  BN_CTX_start(ctx);
  pBStack_68 = in_mont;
  if (((in_mont != (BN_MONT_CTX *)0x0) ||
      ((pBStack_68 = BN_MONT_CTX_new(), puVar13 = (undefined8 *)local_148,
       pBStack_68 != (BN_MONT_CTX *)0x0 &&
       (iVar5 = BN_MONT_CTX_set(pBStack_68,m,ctx), puVar13 = (undefined8 *)local_148, iVar5 != 0))))
     && (((a->neg == 0 && (iVar5 = BN_ucmp(a,m), p_local = (BIGNUM *)a, iVar5 < 0)) ||
         ((p_local = (BIGNUM *)BN_CTX_get(ctx), puVar13 = (undefined8 *)local_148,
          p_local != (BIGNUM *)0x0 &&
          (iVar5 = BN_nnmod((BIGNUM *)p_local,a,m,ctx), puVar13 = (undefined8 *)local_148,
          iVar5 != 0)))))) {
    if ((p_local->top == 0x10) &&
       (((p->top == 0x10 && (iVar5 = BN_num_bits(m), iVar5 == 0x400)) &&
        (iVar5 = rsaz_avx2_eligible(), iVar5 != 0)))) {
      pBVar8 = bn_wexpand(in_stack_fffffffffffffec0,words);
      puVar13 = (undefined8 *)local_148;
      if (pBVar8 != (BIGNUM *)0x0) {
        RSAZ_1024_mod_exp_avx2
                  (in_stack_00001530,in_stack_00001528,in_stack_00001520,in_stack_00001518,
                   in_stack_00001510,in_stack_00001508);
        rr->top = 0x10;
        rr->neg = 0;
        bn_correct_top((BIGNUM *)rr);
        wvalue = 1;
        puVar13 = (undefined8 *)local_148;
      }
    }
    else if (((p_local->top == 8) && (p->top == 8)) && (iVar5 = BN_num_bits(m), iVar5 == 0x200)) {
      pBVar8 = bn_wexpand(in_stack_fffffffffffffec0,words);
      puVar13 = (undefined8 *)local_148;
      if (pBVar8 != (BIGNUM *)0x0) {
        RSAZ_512_mod_exp(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                         in_stack_000003b0,in_stack_000003a8);
        rr->top = 8;
        rr->neg = 0;
        bn_correct_top((BIGNUM *)rr);
        wvalue = 1;
        puVar13 = (undefined8 *)local_148;
      }
    }
    else {
      if (iVar4 < 0x3aa) {
        if (iVar4 < 0x133) {
          if (iVar4 < 0x5a) {
            local_e0 = 1;
            if (0x16 < iVar4) {
              local_e0 = 3;
            }
          }
          else {
            local_e0 = 4;
          }
          local_dc = local_e0;
        }
        else {
          local_dc = 5;
        }
        local_d8 = local_dc;
      }
      else {
        local_d8 = 6;
      }
      wmask = local_d8;
      if (4 < local_d8) {
        wmask = 5;
        powerbuf._4_4_ = top_00 << 3;
      }
      iVar5 = 1 << (sbyte)wmask;
      local_e8 = iVar5;
      if (iVar5 < (int)(top_00 * 2)) {
        local_e8 = top_00 << 1;
      }
      powerbuf._4_4_ = powerbuf._4_4_ + (top_00 * iVar5 + local_e8) * 8;
      if (powerbuf._4_4_ < 0xc00) {
        puStack_78 = local_148 + -((long)powerbuf._4_4_ + 0x4fU & 0xfffffffffffffff0);
        puVar3 = (undefined8 *)puStack_78;
      }
      else {
        puStack_78 = (undefined1 *)CRYPTO_malloc(powerbuf._4_4_ + 0x40,"crypto/bn/bn_exp.c",0x2d0);
        puVar13 = (undefined8 *)local_148;
        puVar3 = (undefined8 *)local_148;
        if (puStack_78 == (undefined1 *)0x0) goto LAB_0022354c;
      }
      puVar13 = puVar3;
      tmp._16_8_ = puStack_78 + (0x40 - ((ulong)puStack_78 & 0x3f));
      puVar13[-1] = 0x222ad5;
      memset((void *)tmp._16_8_,0,(long)powerbuf._4_4_);
      if (powerbuf._4_4_ < 0xc00) {
        puStack_78 = (undefined1 *)0x0;
      }
      am._16_8_ = tmp._16_8_ + (long)(int)top_00 * 8 * (long)iVar5;
      reduced = (BIGNUM *)(am._16_8_ + (long)(int)top_00 * 8);
      am.d._0_4_ = 0;
      tmp.d._0_4_ = 0;
      am.d._4_4_ = top_00;
      am.top = 0;
      am.dmax = 2;
      if ((m->d[(int)(top_00 - 1)] & 0x8000000000000000) == 0) {
        puVar13[-1] = 0x222bf6;
        BN_value_one();
        puVar13[-1] = 0x222c0d;
        iVar6 = bn_to_mont_fixed_top
                          ((BIGNUM *)puVar13[3],(BIGNUM *)puVar13[2],(BN_MONT_CTX *)puVar13[1],
                           (BN_CTX *)*puVar13);
        if (iVar6 == 0) goto LAB_0022354c;
      }
      else {
        *(ulong *)am._16_8_ = -*m->d;
        for (ret = 1; tmp.d._0_4_ = top_00, ret < (int)top_00; ret = ret + 1) {
          *(ulong *)(am._16_8_ + (long)ret * 8) = m->d[ret] ^ 0xffffffffffffffff;
        }
      }
      puVar13[-1] = 0x222c31;
      iVar6 = bn_to_mont_fixed_top
                        ((BIGNUM *)puVar13[3],(BIGNUM *)puVar13[2],(BN_MONT_CTX *)puVar13[1],
                         (BN_CTX *)*puVar13);
      uVar2 = am._16_8_;
      if (iVar6 != 0) {
        if ((wmask == 5) && (1 < (int)top_00)) {
          puVar9 = pBStack_68->n0;
          for (ret = (int)am.d; ret < (int)top_00; ret = ret + 1) {
            (&reduced->d)[ret] = (unsigned_long *)0x0;
          }
          for (ret = (uint)tmp.d; ret < (int)top_00; ret = ret + 1) {
            *(undefined8 *)(am._16_8_ + (long)ret * 8) = 0;
          }
          ppuVar10 = &reduced->d + (int)top_00;
          for (ret = 0; ret < (int)top_00; ret = ret + 1) {
            ppuVar10[ret] = (unsigned_long *)(pBStack_68->N).d[ret];
          }
          puVar13[-1] = 0x222d26;
          bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,0);
          pBVar8 = reduced;
          lVar14 = (long)(int)am.d;
          puVar13[-1] = 0x222d42;
          bn_scatter5(pBVar8,lVar14,tmp._16_8_,1);
          uVar2 = am._16_8_;
          pBVar8 = reduced;
          puVar13[-1] = 0x222d6e;
          bn_mul_mont(uVar2,pBVar8,pBVar8,ppuVar10,puVar9,top_00);
          uVar2 = am._16_8_;
          puVar13[-1] = 0x222d87;
          bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,2);
          for (ret = 4; uVar2 = am._16_8_, ret < 0x20; ret = ret << 1) {
            puVar13[-1] = 0x222dc0;
            bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222dd8;
            bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)ret);
          }
          for (ret = 3; uVar2 = am._16_8_, pBVar8 = reduced, ret < 8; ret = ret + 2) {
            *(int *)(puVar13 + -2) = ret + -1;
            puVar13[-3] = 0x222e29;
            bn_mul_mont_gather5(uVar2,pBVar8,tmp._16_8_,ppuVar10,puVar9,top_00);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222e45;
            bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)ret);
            local_d4 = ret;
            while (uVar2 = am._16_8_, local_d4 = local_d4 << 1, local_d4 < 0x20) {
              puVar13[-1] = 0x222e85;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar13[-1] = 0x222ea0;
              bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)local_d4);
            }
          }
          for (; uVar2 = am._16_8_, pBVar8 = reduced, ret < 0x10; ret = ret + 2) {
            *(int *)(puVar13 + -2) = ret + -1;
            puVar13[-3] = 0x222f02;
            bn_mul_mont_gather5(uVar2,pBVar8,tmp._16_8_,ppuVar10,puVar9,top_00);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222f1e;
            bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)ret);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222f4a;
            bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222f66;
            bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)(ret << 1));
          }
          for (; uVar2 = am._16_8_, pBVar8 = reduced, ret < 0x20; ret = ret + 2) {
            *(int *)(puVar13 + -2) = ret + -1;
            puVar13[-3] = 0x222fb2;
            bn_mul_mont_gather5(uVar2,pBVar8,tmp._16_8_,ppuVar10,puVar9,top_00);
            uVar2 = am._16_8_;
            puVar13[-1] = 0x222fce;
            bn_scatter5(uVar2,(long)(int)top_00,tmp._16_8_,(long)ret);
          }
          iVar5 = (iVar4 + -1) % 5 + 1;
          window = iVar4 - iVar5;
          puVar13[-1] = 0x223014;
          uVar11 = bn_get_bits((BIGNUM *)p,window);
          uVar2 = am._16_8_;
          puVar13[-1] = 0x223036;
          bn_gather5(uVar2,(long)(int)top_00,tmp._16_8_,
                     (long)(int)((uint)uVar11 & (1 << ((byte)iVar5 & 0x1f)) - 1U));
          if ((top_00 & 7) == 0) {
            while (0 < window) {
              local_148 = (undefined1  [4])am.neg;
              words = am.flags;
              puVar1 = p->d;
              window = window + -5;
              uVar15 = am._16_8_;
              puVar16 = (uchar *)tmp._16_8_;
              ppuVar17 = ppuVar10;
              puVar13[-1] = 0x22323f;
              uVar7 = bn_get_bits5(puVar1);
              uVar2 = _local_148;
              *(undefined4 *)(puVar13 + -2) = uVar7;
              puVar13[-3] = 0x223275;
              bn_power5(uVar2,uVar15,puVar16,ppuVar17,puVar9,top_00);
            }
          }
          else {
            while (uVar2 = am._16_8_, 0 < window) {
              puVar13[-1] = 0x22307d;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar13[-1] = 0x2230a9;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar13[-1] = 0x2230d5;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar13[-1] = 0x223101;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar13[-1] = 0x22312d;
              bn_mul_mont(uVar2,uVar2,uVar2,ppuVar10,puVar9,top_00);
              uVar2 = am._16_8_;
              puVar1 = p->d;
              window = window + -5;
              puVar13[-1] = 0x22318e;
              uVar7 = bn_get_bits5(puVar1);
              *(undefined4 *)(puVar13 + -2) = uVar7;
              puVar13[-3] = 0x2231c4;
              bn_mul_mont_gather5(uVar2,uVar2,tmp._16_8_,ppuVar10,puVar9,top_00);
            }
          }
          uVar2 = am._16_8_;
          puVar13[-1] = 0x2232a9;
          wvalue = bn_from_montgomery(uVar2,uVar2,0,ppuVar10,puVar9,top_00);
          puVar13[-1] = 0x2232c1;
          bn_correct_top((BIGNUM *)&am.neg);
          if (wvalue == 0) {
LAB_00223526:
            puVar13[-1] = 0x22353e;
            iVar4 = BN_from_montgomery(rr,(BIGNUM *)&am.neg,pBStack_68,ctx);
            if (iVar4 != 0) {
              wvalue = 1;
            }
          }
          else {
            puVar13[-1] = 0x2232d7;
            pBVar12 = BN_copy(rr,(BIGNUM *)&am.neg);
            if (pBVar12 == (BIGNUM *)0x0) {
              wvalue = 0;
            }
          }
        }
        else {
          puVar13[-1] = 0x223307;
          iVar6 = MOD_EXP_CTIME_COPY_TO_PREBUF((BIGNUM *)&am.neg,top_00,(uchar *)tmp._16_8_,0,wmask)
          ;
          if (iVar6 != 0) {
            puVar13[-1] = 0x22332d;
            iVar6 = MOD_EXP_CTIME_COPY_TO_PREBUF
                              ((BIGNUM *)&reduced,top_00,(uchar *)tmp._16_8_,1,wmask);
            if (iVar6 != 0) {
              if (1 < (uint)wmask) {
                puVar13[-1] = 0x22335f;
                iVar6 = bn_mul_mont_fixed_top
                                  ((BIGNUM *)puVar13[6],(BIGNUM *)puVar13[5],(BIGNUM *)puVar13[4],
                                   (BN_MONT_CTX *)puVar13[3],(BN_CTX *)puVar13[2]);
                if (iVar6 == 0) goto LAB_0022354c;
                puVar13[-1] = 0x223385;
                iVar6 = MOD_EXP_CTIME_COPY_TO_PREBUF
                                  ((BIGNUM *)&am.neg,top_00,(uchar *)tmp._16_8_,2,wmask);
                if (iVar6 == 0) goto LAB_0022354c;
                for (ret = 3; ret < iVar5; ret = ret + 1) {
                  puVar13[-1] = 0x2233bc;
                  iVar6 = bn_mul_mont_fixed_top
                                    ((BIGNUM *)puVar13[6],(BIGNUM *)puVar13[5],(BIGNUM *)puVar13[4],
                                     (BN_MONT_CTX *)puVar13[3],(BN_CTX *)puVar13[2]);
                  if (iVar6 == 0) goto LAB_0022354c;
                  puVar13[-1] = 0x2233e0;
                  iVar6 = MOD_EXP_CTIME_COPY_TO_PREBUF
                                    ((BIGNUM *)&am.neg,top_00,(uchar *)tmp._16_8_,ret,wmask);
                  if (iVar6 == 0) goto LAB_0022354c;
                }
              }
              iVar4 = iVar4 - ((iVar4 + -1) % wmask + 1);
              puVar13[-1] = 0x223430;
              bn_get_bits((BIGNUM *)p,iVar4);
              puVar13[-1] = 0x223454;
              iVar5 = MOD_EXP_CTIME_COPY_FROM_PREBUF
                                ((BIGNUM *)puVar13[0xe],*(int *)((long)puVar13 + 0x6c),
                                 (uchar *)puVar13[0xc],*(int *)((long)puVar13 + 0x5c),
                                 *(int *)(puVar13 + 0xb));
              while (iVar5 != 0) {
                if (iVar4 < 1) goto LAB_00223526;
                for (ret = 0; ret < wmask; ret = ret + 1) {
                  puVar13[-1] = 0x2234a1;
                  iVar5 = bn_mul_mont_fixed_top
                                    ((BIGNUM *)puVar13[6],(BIGNUM *)puVar13[5],(BIGNUM *)puVar13[4],
                                     (BN_MONT_CTX *)puVar13[3],(BN_CTX *)puVar13[2]);
                  if (iVar5 == 0) goto LAB_0022354c;
                }
                iVar4 = iVar4 - wmask;
                puVar13[-1] = 0x2234cf;
                bn_get_bits((BIGNUM *)p,iVar4);
                puVar13[-1] = 0x2234f3;
                iVar5 = MOD_EXP_CTIME_COPY_FROM_PREBUF
                                  ((BIGNUM *)puVar13[0xe],*(int *)((long)puVar13 + 0x6c),
                                   (uchar *)puVar13[0xc],*(int *)((long)puVar13 + 0x5c),
                                   *(int *)(puVar13 + 0xb));
                if (iVar5 == 0) break;
                puVar13[-1] = 0x223518;
                iVar5 = bn_mul_mont_fixed_top
                                  ((BIGNUM *)puVar13[6],(BIGNUM *)puVar13[5],(BIGNUM *)puVar13[4],
                                   (BN_MONT_CTX *)puVar13[3],(BN_CTX *)puVar13[2]);
              }
            }
          }
        }
      }
    }
  }
LAB_0022354c:
  if (in_mont == (BN_MONT_CTX *)0x0) {
    *(undefined8 *)((long)puVar13 + -8) = 0x22355c;
    BN_MONT_CTX_free(pBStack_68);
  }
  if (tmp._16_8_ != 0) {
    *(undefined8 *)((long)puVar13 + -8) = 0x223570;
    OPENSSL_cleanse((void *)tmp._16_8_,(long)powerbuf._4_4_);
    *(undefined8 *)((long)puVar13 + -8) = 0x223585;
    CRYPTO_free(puStack_78);
  }
  *(undefined8 *)((long)puVar13 + -8) = 0x22358e;
  BN_CTX_end(ctx);
  return wvalue;
}

Assistant:

int BN_mod_exp_mont_consttime(BIGNUM *rr, const BIGNUM *a, const BIGNUM *p,
                              const BIGNUM *m, BN_CTX *ctx,
                              BN_MONT_CTX *in_mont)
{
    int i, bits, ret = 0, window, wvalue, wmask, window0;
    int top;
    BN_MONT_CTX *mont = NULL;

    int numPowers;
    unsigned char *powerbufFree = NULL;
    int powerbufLen = 0;
    unsigned char *powerbuf = NULL;
    BIGNUM tmp, am;
#if defined(SPARC_T4_MONT)
    unsigned int t4 = 0;
#endif

    bn_check_top(a);
    bn_check_top(p);
    bn_check_top(m);

    if (!BN_is_odd(m)) {
        ERR_raise(ERR_LIB_BN, BN_R_CALLED_WITH_EVEN_MODULUS);
        return 0;
    }

    top = m->top;

    /*
     * Use all bits stored in |p|, rather than |BN_num_bits|, so we do not leak
     * whether the top bits are zero.
     */
    bits = p->top * BN_BITS2;
    if (bits == 0) {
        /* x**0 mod 1, or x**0 mod -1 is still zero. */
        if (BN_abs_is_word(m, 1)) {
            ret = 1;
            BN_zero(rr);
        } else {
            ret = BN_one(rr);
        }
        return ret;
    }

    BN_CTX_start(ctx);

    /*
     * Allocate a montgomery context if it was not supplied by the caller. If
     * this is not done, things will break in the montgomery part.
     */
    if (in_mont != NULL)
        mont = in_mont;
    else {
        if ((mont = BN_MONT_CTX_new()) == NULL)
            goto err;
        if (!BN_MONT_CTX_set(mont, m, ctx))
            goto err;
    }

    if (a->neg || BN_ucmp(a, m) >= 0) {
        BIGNUM *reduced = BN_CTX_get(ctx);
        if (reduced == NULL
            || !BN_nnmod(reduced, a, m, ctx)) {
            goto err;
        }
        a = reduced;
    }

#ifdef RSAZ_ENABLED
    /*
     * If the size of the operands allow it, perform the optimized
     * RSAZ exponentiation. For further information see
     * crypto/bn/rsaz_exp.c and accompanying assembly modules.
     */
    if ((16 == a->top) && (16 == p->top) && (BN_num_bits(m) == 1024)
        && rsaz_avx2_eligible()) {
        if (NULL == bn_wexpand(rr, 16))
            goto err;
        RSAZ_1024_mod_exp_avx2(rr->d, a->d, p->d, m->d, mont->RR.d,
                               mont->n0[0]);
        rr->top = 16;
        rr->neg = 0;
        bn_correct_top(rr);
        ret = 1;
        goto err;
    } else if ((8 == a->top) && (8 == p->top) && (BN_num_bits(m) == 512)) {
        if (NULL == bn_wexpand(rr, 8))
            goto err;
        RSAZ_512_mod_exp(rr->d, a->d, p->d, m->d, mont->n0[0], mont->RR.d);
        rr->top = 8;
        rr->neg = 0;
        bn_correct_top(rr);
        ret = 1;
        goto err;
    }
#endif

    /* Get the window size to use with size of p. */
    window = BN_window_bits_for_ctime_exponent_size(bits);
#if defined(SPARC_T4_MONT)
    if (window >= 5 && (top & 15) == 0 && top <= 64 &&
        (OPENSSL_sparcv9cap_P[1] & (CFR_MONTMUL | CFR_MONTSQR)) ==
        (CFR_MONTMUL | CFR_MONTSQR) && (t4 = OPENSSL_sparcv9cap_P[0]))
        window = 5;
    else
#endif
#if defined(OPENSSL_BN_ASM_MONT5)
    if (window >= 5) {
        window = 5;             /* ~5% improvement for RSA2048 sign, and even
                                 * for RSA4096 */
        /* reserve space for mont->N.d[] copy */
        powerbufLen += top * sizeof(mont->N.d[0]);
    }
#endif
    (void)0;

    /*
     * Allocate a buffer large enough to hold all of the pre-computed powers
     * of am, am itself and tmp.
     */
    numPowers = 1 << window;
    powerbufLen += sizeof(m->d[0]) * (top * numPowers +
                                      ((2 * top) >
                                       numPowers ? (2 * top) : numPowers));
#ifdef alloca
    if (powerbufLen < 3072)
        powerbufFree =
            alloca(powerbufLen + MOD_EXP_CTIME_MIN_CACHE_LINE_WIDTH);
    else
#endif
        if ((powerbufFree =
             OPENSSL_malloc(powerbufLen + MOD_EXP_CTIME_MIN_CACHE_LINE_WIDTH))
            == NULL)
        goto err;

    powerbuf = MOD_EXP_CTIME_ALIGN(powerbufFree);
    memset(powerbuf, 0, powerbufLen);

#ifdef alloca
    if (powerbufLen < 3072)
        powerbufFree = NULL;
#endif

    /* lay down tmp and am right after powers table */
    tmp.d = (BN_ULONG *)(powerbuf + sizeof(m->d[0]) * top * numPowers);
    am.d = tmp.d + top;
    tmp.top = am.top = 0;
    tmp.dmax = am.dmax = top;
    tmp.neg = am.neg = 0;
    tmp.flags = am.flags = BN_FLG_STATIC_DATA;

    /* prepare a^0 in Montgomery domain */
#if 1                           /* by Shay Gueron's suggestion */
    if (m->d[top - 1] & (((BN_ULONG)1) << (BN_BITS2 - 1))) {
        /* 2^(top*BN_BITS2) - m */
        tmp.d[0] = (0 - m->d[0]) & BN_MASK2;
        for (i = 1; i < top; i++)
            tmp.d[i] = (~m->d[i]) & BN_MASK2;
        tmp.top = top;
    } else
#endif
    if (!bn_to_mont_fixed_top(&tmp, BN_value_one(), mont, ctx))
        goto err;

    /* prepare a^1 in Montgomery domain */
    if (!bn_to_mont_fixed_top(&am, a, mont, ctx))
        goto err;

#if defined(SPARC_T4_MONT)
    if (t4) {
        typedef int (*bn_pwr5_mont_f) (BN_ULONG *tp, const BN_ULONG *np,
                                       const BN_ULONG *n0, const void *table,
                                       int power, int bits);
        int bn_pwr5_mont_t4_8(BN_ULONG *tp, const BN_ULONG *np,
                              const BN_ULONG *n0, const void *table,
                              int power, int bits);
        int bn_pwr5_mont_t4_16(BN_ULONG *tp, const BN_ULONG *np,
                               const BN_ULONG *n0, const void *table,
                               int power, int bits);
        int bn_pwr5_mont_t4_24(BN_ULONG *tp, const BN_ULONG *np,
                               const BN_ULONG *n0, const void *table,
                               int power, int bits);
        int bn_pwr5_mont_t4_32(BN_ULONG *tp, const BN_ULONG *np,
                               const BN_ULONG *n0, const void *table,
                               int power, int bits);
        static const bn_pwr5_mont_f pwr5_funcs[4] = {
            bn_pwr5_mont_t4_8, bn_pwr5_mont_t4_16,
            bn_pwr5_mont_t4_24, bn_pwr5_mont_t4_32
        };
        bn_pwr5_mont_f pwr5_worker = pwr5_funcs[top / 16 - 1];

        typedef int (*bn_mul_mont_f) (BN_ULONG *rp, const BN_ULONG *ap,
                                      const void *bp, const BN_ULONG *np,
                                      const BN_ULONG *n0);
        int bn_mul_mont_t4_8(BN_ULONG *rp, const BN_ULONG *ap, const void *bp,
                             const BN_ULONG *np, const BN_ULONG *n0);
        int bn_mul_mont_t4_16(BN_ULONG *rp, const BN_ULONG *ap,
                              const void *bp, const BN_ULONG *np,
                              const BN_ULONG *n0);
        int bn_mul_mont_t4_24(BN_ULONG *rp, const BN_ULONG *ap,
                              const void *bp, const BN_ULONG *np,
                              const BN_ULONG *n0);
        int bn_mul_mont_t4_32(BN_ULONG *rp, const BN_ULONG *ap,
                              const void *bp, const BN_ULONG *np,
                              const BN_ULONG *n0);
        static const bn_mul_mont_f mul_funcs[4] = {
            bn_mul_mont_t4_8, bn_mul_mont_t4_16,
            bn_mul_mont_t4_24, bn_mul_mont_t4_32
        };
        bn_mul_mont_f mul_worker = mul_funcs[top / 16 - 1];

        void bn_mul_mont_vis3(BN_ULONG *rp, const BN_ULONG *ap,
                              const void *bp, const BN_ULONG *np,
                              const BN_ULONG *n0, int num);
        void bn_mul_mont_t4(BN_ULONG *rp, const BN_ULONG *ap,
                            const void *bp, const BN_ULONG *np,
                            const BN_ULONG *n0, int num);
        void bn_mul_mont_gather5_t4(BN_ULONG *rp, const BN_ULONG *ap,
                                    const void *table, const BN_ULONG *np,
                                    const BN_ULONG *n0, int num, int power);
        void bn_flip_n_scatter5_t4(const BN_ULONG *inp, size_t num,
                                   void *table, size_t power);
        void bn_gather5_t4(BN_ULONG *out, size_t num,
                           void *table, size_t power);
        void bn_flip_t4(BN_ULONG *dst, BN_ULONG *src, size_t num);

        BN_ULONG *np = mont->N.d, *n0 = mont->n0;
        int stride = 5 * (6 - (top / 16 - 1)); /* multiple of 5, but less
                                                * than 32 */

        /*
         * BN_to_montgomery can contaminate words above .top [in
         * BN_DEBUG build...
         */
        for (i = am.top; i < top; i++)
            am.d[i] = 0;
        for (i = tmp.top; i < top; i++)
            tmp.d[i] = 0;

        bn_flip_n_scatter5_t4(tmp.d, top, powerbuf, 0);
        bn_flip_n_scatter5_t4(am.d, top, powerbuf, 1);
        if (!(*mul_worker) (tmp.d, am.d, am.d, np, n0) &&
            !(*mul_worker) (tmp.d, am.d, am.d, np, n0))
            bn_mul_mont_vis3(tmp.d, am.d, am.d, np, n0, top);
        bn_flip_n_scatter5_t4(tmp.d, top, powerbuf, 2);

        for (i = 3; i < 32; i++) {
            /* Calculate a^i = a^(i-1) * a */
            if (!(*mul_worker) (tmp.d, tmp.d, am.d, np, n0) &&
                !(*mul_worker) (tmp.d, tmp.d, am.d, np, n0))
                bn_mul_mont_vis3(tmp.d, tmp.d, am.d, np, n0, top);
            bn_flip_n_scatter5_t4(tmp.d, top, powerbuf, i);
        }

        /* switch to 64-bit domain */
        np = alloca(top * sizeof(BN_ULONG));
        top /= 2;
        bn_flip_t4(np, mont->N.d, top);

        /*
         * The exponent may not have a whole number of fixed-size windows.
         * To simplify the main loop, the initial window has between 1 and
         * full-window-size bits such that what remains is always a whole
         * number of windows
         */
        window0 = (bits - 1) % 5 + 1;
        wmask = (1 << window0) - 1;
        bits -= window0;
        wvalue = bn_get_bits(p, bits) & wmask;
        bn_gather5_t4(tmp.d, top, powerbuf, wvalue);

        /*
         * Scan the exponent one window at a time starting from the most
         * significant bits.
         */
        while (bits > 0) {
            if (bits < stride)
                stride = bits;
            bits -= stride;
            wvalue = bn_get_bits(p, bits);

            if ((*pwr5_worker) (tmp.d, np, n0, powerbuf, wvalue, stride))
                continue;
            /* retry once and fall back */
            if ((*pwr5_worker) (tmp.d, np, n0, powerbuf, wvalue, stride))
                continue;

            bits += stride - 5;
            wvalue >>= stride - 5;
            wvalue &= 31;
            bn_mul_mont_t4(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_mul_mont_t4(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_mul_mont_t4(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_mul_mont_t4(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_mul_mont_t4(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_mul_mont_gather5_t4(tmp.d, tmp.d, powerbuf, np, n0, top,
                                   wvalue);
        }

        bn_flip_t4(tmp.d, tmp.d, top);
        top *= 2;
        /* back to 32-bit domain */
        tmp.top = top;
        bn_correct_top(&tmp);
        OPENSSL_cleanse(np, top * sizeof(BN_ULONG));
    } else
#endif
#if defined(OPENSSL_BN_ASM_MONT5)
    if (window == 5 && top > 1) {
        /*
         * This optimization uses ideas from http://eprint.iacr.org/2011/239,
         * specifically optimization of cache-timing attack countermeasures
         * and pre-computation optimization.
         */

        /*
         * Dedicated window==4 case improves 512-bit RSA sign by ~15%, but as
         * 512-bit RSA is hardly relevant, we omit it to spare size...
         */
        void bn_mul_mont_gather5(BN_ULONG *rp, const BN_ULONG *ap,
                                 const void *table, const BN_ULONG *np,
                                 const BN_ULONG *n0, int num, int power);
        void bn_scatter5(const BN_ULONG *inp, size_t num,
                         void *table, size_t power);
        void bn_gather5(BN_ULONG *out, size_t num, void *table, size_t power);
        void bn_power5(BN_ULONG *rp, const BN_ULONG *ap,
                       const void *table, const BN_ULONG *np,
                       const BN_ULONG *n0, int num, int power);
        int bn_get_bits5(const BN_ULONG *ap, int off);
        int bn_from_montgomery(BN_ULONG *rp, const BN_ULONG *ap,
                               const BN_ULONG *not_used, const BN_ULONG *np,
                               const BN_ULONG *n0, int num);

        BN_ULONG *n0 = mont->n0, *np;

        /*
         * BN_to_montgomery can contaminate words above .top [in
         * BN_DEBUG build...
         */
        for (i = am.top; i < top; i++)
            am.d[i] = 0;
        for (i = tmp.top; i < top; i++)
            tmp.d[i] = 0;

        /*
         * copy mont->N.d[] to improve cache locality
         */
        for (np = am.d + top, i = 0; i < top; i++)
            np[i] = mont->N.d[i];

        bn_scatter5(tmp.d, top, powerbuf, 0);
        bn_scatter5(am.d, am.top, powerbuf, 1);
        bn_mul_mont(tmp.d, am.d, am.d, np, n0, top);
        bn_scatter5(tmp.d, top, powerbuf, 2);

# if 0
        for (i = 3; i < 32; i++) {
            /* Calculate a^i = a^(i-1) * a */
            bn_mul_mont_gather5(tmp.d, am.d, powerbuf, np, n0, top, i - 1);
            bn_scatter5(tmp.d, top, powerbuf, i);
        }
# else
        /* same as above, but uses squaring for 1/2 of operations */
        for (i = 4; i < 32; i *= 2) {
            bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_scatter5(tmp.d, top, powerbuf, i);
        }
        for (i = 3; i < 8; i += 2) {
            int j;
            bn_mul_mont_gather5(tmp.d, am.d, powerbuf, np, n0, top, i - 1);
            bn_scatter5(tmp.d, top, powerbuf, i);
            for (j = 2 * i; j < 32; j *= 2) {
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_scatter5(tmp.d, top, powerbuf, j);
            }
        }
        for (; i < 16; i += 2) {
            bn_mul_mont_gather5(tmp.d, am.d, powerbuf, np, n0, top, i - 1);
            bn_scatter5(tmp.d, top, powerbuf, i);
            bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
            bn_scatter5(tmp.d, top, powerbuf, 2 * i);
        }
        for (; i < 32; i += 2) {
            bn_mul_mont_gather5(tmp.d, am.d, powerbuf, np, n0, top, i - 1);
            bn_scatter5(tmp.d, top, powerbuf, i);
        }
# endif
        /*
         * The exponent may not have a whole number of fixed-size windows.
         * To simplify the main loop, the initial window has between 1 and
         * full-window-size bits such that what remains is always a whole
         * number of windows
         */
        window0 = (bits - 1) % 5 + 1;
        wmask = (1 << window0) - 1;
        bits -= window0;
        wvalue = bn_get_bits(p, bits) & wmask;
        bn_gather5(tmp.d, top, powerbuf, wvalue);

        /*
         * Scan the exponent one window at a time starting from the most
         * significant bits.
         */
        if (top & 7) {
            while (bits > 0) {
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_mul_mont(tmp.d, tmp.d, tmp.d, np, n0, top);
                bn_mul_mont_gather5(tmp.d, tmp.d, powerbuf, np, n0, top,
                                    bn_get_bits5(p->d, bits -= 5));
            }
        } else {
            while (bits > 0) {
                bn_power5(tmp.d, tmp.d, powerbuf, np, n0, top,
                          bn_get_bits5(p->d, bits -= 5));
            }
        }

        ret = bn_from_montgomery(tmp.d, tmp.d, NULL, np, n0, top);
        tmp.top = top;
        bn_correct_top(&tmp);
        if (ret) {
            if (!BN_copy(rr, &tmp))
                ret = 0;
            goto err;           /* non-zero ret means it's not error */
        }
    } else
#endif
    {
        if (!MOD_EXP_CTIME_COPY_TO_PREBUF(&tmp, top, powerbuf, 0, window))
            goto err;
        if (!MOD_EXP_CTIME_COPY_TO_PREBUF(&am, top, powerbuf, 1, window))
            goto err;

        /*
         * If the window size is greater than 1, then calculate
         * val[i=2..2^winsize-1]. Powers are computed as a*a^(i-1) (even
         * powers could instead be computed as (a^(i/2))^2 to use the slight
         * performance advantage of sqr over mul).
         */
        if (window > 1) {
            if (!bn_mul_mont_fixed_top(&tmp, &am, &am, mont, ctx))
                goto err;
            if (!MOD_EXP_CTIME_COPY_TO_PREBUF(&tmp, top, powerbuf, 2,
                                              window))
                goto err;
            for (i = 3; i < numPowers; i++) {
                /* Calculate a^i = a^(i-1) * a */
                if (!bn_mul_mont_fixed_top(&tmp, &am, &tmp, mont, ctx))
                    goto err;
                if (!MOD_EXP_CTIME_COPY_TO_PREBUF(&tmp, top, powerbuf, i,
                                                  window))
                    goto err;
            }
        }

        /*
         * The exponent may not have a whole number of fixed-size windows.
         * To simplify the main loop, the initial window has between 1 and
         * full-window-size bits such that what remains is always a whole
         * number of windows
         */
        window0 = (bits - 1) % window + 1;
        wmask = (1 << window0) - 1;
        bits -= window0;
        wvalue = bn_get_bits(p, bits) & wmask;
        if (!MOD_EXP_CTIME_COPY_FROM_PREBUF(&tmp, top, powerbuf, wvalue,
                                            window))
            goto err;

        wmask = (1 << window) - 1;
        /*
         * Scan the exponent one window at a time starting from the most
         * significant bits.
         */
        while (bits > 0) {

            /* Square the result window-size times */
            for (i = 0; i < window; i++)
                if (!bn_mul_mont_fixed_top(&tmp, &tmp, &tmp, mont, ctx))
                    goto err;

            /*
             * Get a window's worth of bits from the exponent
             * This avoids calling BN_is_bit_set for each bit, which
             * is not only slower but also makes each bit vulnerable to
             * EM (and likely other) side-channel attacks like One&Done
             * (for details see "One&Done: A Single-Decryption EM-Based
             *  Attack on OpenSSL's Constant-Time Blinded RSA" by M. Alam,
             *  H. Khan, M. Dey, N. Sinha, R. Callan, A. Zajic, and
             *  M. Prvulovic, in USENIX Security'18)
             */
            bits -= window;
            wvalue = bn_get_bits(p, bits) & wmask;
            /*
             * Fetch the appropriate pre-computed value from the pre-buf
             */
            if (!MOD_EXP_CTIME_COPY_FROM_PREBUF(&am, top, powerbuf, wvalue,
                                                window))
                goto err;

            /* Multiply the result into the intermediate result */
            if (!bn_mul_mont_fixed_top(&tmp, &tmp, &am, mont, ctx))
                goto err;
        }
    }

    /*
     * Done with zero-padded intermediate BIGNUMs. Final BN_from_montgomery
     * removes padding [if any] and makes return value suitable for public
     * API consumer.
     */
#if defined(SPARC_T4_MONT)
    if (OPENSSL_sparcv9cap_P[0] & (SPARCV9_VIS3 | SPARCV9_PREFER_FPU)) {
        am.d[0] = 1;            /* borrow am */
        for (i = 1; i < top; i++)
            am.d[i] = 0;
        if (!BN_mod_mul_montgomery(rr, &tmp, &am, mont, ctx))
            goto err;
    } else
#endif
    if (!BN_from_montgomery(rr, &tmp, mont, ctx))
        goto err;
    ret = 1;
 err:
    if (in_mont == NULL)
        BN_MONT_CTX_free(mont);
    if (powerbuf != NULL) {
        OPENSSL_cleanse(powerbuf, powerbufLen);
        OPENSSL_free(powerbufFree);
    }
    BN_CTX_end(ctx);
    return ret;
}